

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

bool gl4cts::GLSL420Pack::Utils::doesTypeSupportMatrix(TYPES type)

{
  TestError *this;
  
  if (type < TYPES_MAX) {
    return (3U >> (type & 0xf) & 1) != 0;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,"Invliad enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
             ,0x248);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool Utils::doesTypeSupportMatrix(TYPES type)
{
	bool result = false;

	switch (type)
	{
	case FLOAT:
	case DOUBLE:
		result = true;
		break;
	case INT:
	case UINT:
		result = false;
		break;
	default:
		TCU_FAIL("Invliad enum");
	}

	return result;
}